

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_accessBufferTest_Test::TestBody
          (OpenDDLParserTest_accessBufferTest_Test *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t i;
  char *buffer;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  char *in_R9;
  ulong uVar6;
  AssertHelper local_b8;
  AssertionResult gtest_ar_;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  OpenDDLParser myParser;
  
  buffer = (char *)operator_new__(100);
  for (lVar3 = 0; lVar3 != 100; lVar3 = lVar3 + 1) {
    buffer[lVar3] = (char)lVar3;
  }
  OpenDDLParser::OpenDDLParser(&myParser);
  OpenDDLParser::setBuffer(&myParser,buffer,100);
  gtest_ar_._0_8_ = OpenDDLParser::getBufferSize(&myParser);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"len","myParser.getBufferSize()",&TestBody::len,
             (unsigned_long *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pcVar4 = OpenDDLParser::getBuffer(&myParser);
  uVar6 = 0;
  while( true ) {
    sVar5 = OpenDDLParser::getBufferSize(&myParser);
    if ((100 < uVar6) || (sVar5 <= uVar6)) break;
    pcVar1 = buffer + uVar6;
    pcVar2 = pcVar4 + uVar6;
    uVar6 = uVar6 + 1;
    if (*pcVar1 != *pcVar2) {
      gtest_ar_.success_ = false;
LAB_00134215:
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"equal","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0xbd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b8);
LAB_00134288:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      OpenDDLParser::clear(&myParser);
      buffer[1] = 'c';
      gtest_ar_.success_ = true;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      OpenDDLParser::setBuffer(&myParser,buffer,100);
      OpenDDLParser::clear(&myParser);
      local_b8.data_._0_4_ = 0;
      gtest_ar_._0_8_ = OpenDDLParser::getBufferSize(&myParser);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0U","myParser.getBufferSize()",(uint *)&local_b8,
                 (unsigned_long *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xca,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pcVar4 = OpenDDLParser::getBuffer(&myParser);
      testing::internal::EqHelper<true>::Compare<char_const>
                ((EqHelper<true> *)&gtest_ar,"nullptr","myParser.getBuffer()",(Secret *)0x0,pcVar4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xcb,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      operator_delete__(buffer);
      OpenDDLParser::~OpenDDLParser(&myParser);
      return;
    }
  }
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar5 <= uVar6;
  if (!gtest_ar_.success_) goto LAB_00134215;
  goto LAB_00134288;
}

Assistant:

TEST_F(OpenDDLParserTest, accessBufferTest) {
    static const size_t len = 100;
    char *buffer = new char[len];
    for (size_t i = 0; i < len; i++) {
        buffer[i] = (char)i;
    }
    OpenDDLParser myParser;
    myParser.setBuffer(buffer, len);
    EXPECT_EQ(len, myParser.getBufferSize());
    bool equal(true);
    const char *parserBuffer(myParser.getBuffer());
    for (size_t i = 0; i < myParser.getBufferSize(); i++) {
        if (i > len) {
            equal = false;
            break;
        }
        if (buffer[i] != parserBuffer[i]) {
            equal = false;
            break;
        }
    }
    EXPECT_TRUE(equal);

    bool success(true);
    try {
        myParser.clear();
        buffer[1] = 'c';
    } catch (...) {
        success = false;
    }
    EXPECT_TRUE(success);

    myParser.setBuffer(buffer, len);
    myParser.clear();
    EXPECT_EQ(0U, myParser.getBufferSize());
    EXPECT_EQ(nullptr, myParser.getBuffer());
    delete[] buffer;
}